

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O1

bool ZXing::OneD::
     FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
               (PairMap *all,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               Pairs *stack)

{
  _Rb_tree_header *p_Var1;
  pointer *ppPVar2;
  Pair *pPVar3;
  iterator __position;
  pointer pPVar4;
  pointer pPVar5;
  Character CVar6;
  Character CVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *__range2;
  pointer pPVar14;
  int iVar15;
  Pair *__args;
  bool bVar16;
  
  if (begin._M_current == end._M_current) {
    pPVar4 = (stack->
             super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (stack->
             super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar4 == pPVar5) {
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      pPVar14 = pPVar4;
      do {
        iVar15 = iVar15 + (pPVar14->left).checksum + (pPVar14->right).checksum;
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 != pPVar5);
      iVar15 = iVar15 % 0xd3;
    }
    bVar16 = (pPVar4->left).value ==
             ((int)((ulong)((long)pPVar5 - (long)pPVar4) >> 2) * 0x71c71c72 -
             (uint)(pPVar5[-1].right.value == -1)) * 0xd3 + iVar15 + -0x34c;
  }
  else {
    p_Var13 = (all->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(all->_M_t)._M_impl.super__Rb_tree_header;
    p_Var12 = &p_Var1->_M_header;
    if (p_Var13 != (_Base_ptr)0x0) {
      do {
        if (*begin._M_current <= (int)p_Var13[1]._M_color) {
          p_Var12 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < *begin._M_current];
      } while (p_Var13 != (_Base_ptr)0x0);
    }
    p_Var13 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var13 = p_Var12, *begin._M_current < (int)p_Var12[1]._M_color)) {
      p_Var13 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var13 != p_Var1) {
      __args = (Pair *)p_Var13[1]._M_parent;
      pPVar3 = (Pair *)p_Var13[1]._M_left;
      bVar16 = __args != pPVar3;
      if (bVar16) {
        iVar15 = 0;
        do {
          if ((__args->right).value != -1 || begin._M_current + 1 == end._M_current) {
            __position._M_current =
                 (stack->
                 super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (stack->
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>::
              _M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>
                        ((vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>
                          *)stack,__position,__args);
            }
            else {
              (__position._M_current)->count = __args->count;
              CVar6 = __args->left;
              CVar7 = __args->right;
              iVar8 = __args->xStart;
              iVar9 = __args->xStop;
              iVar10 = __args->y;
              (__position._M_current)->finder = __args->finder;
              (__position._M_current)->xStart = iVar8;
              (__position._M_current)->xStop = iVar9;
              (__position._M_current)->y = iVar10;
              (__position._M_current)->left = CVar6;
              (__position._M_current)->right = CVar7;
              ppPVar2 = &(stack->
                         super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar2 = *ppPVar2 + 1;
            }
            bVar11 = FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                               (all,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )(begin._M_current + 1),end,stack);
            if (bVar11) {
              bVar11 = true;
              goto LAB_001620de;
            }
            ppPVar2 = &(stack->
                       super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppPVar2 = *ppPVar2 + -1;
          }
          __args = __args + 1;
          bVar16 = iVar15 == 0;
          iVar15 = iVar15 + -1;
          bVar16 = bVar16 && __args != pPVar3;
        } while (bVar16);
      }
      bVar11 = false;
LAB_001620de:
      if (bVar16) {
        return bVar11;
      }
    }
    bVar16 = false;
  }
  return bVar16;
}

Assistant:

static bool FindValidSequence(const PairMap& all, ITER begin, ITER end, Pairs& stack)
{
	if (begin == end)
		return ChecksumIsValid(stack);

	if (auto ppairs = all.find(*begin); ppairs != all.end()) {
		// only try the N most common pairs, this means the absolute maximum number of ChecksumIsValid() evaluations
		// is N^11 (11 is the maximum sequence length).
		constexpr int N = 2;
		// TODO c++20 ranges::views::take()
		auto& pairs = ppairs->second;
		int n = 0;
		for (auto p = pairs.begin(), pend = pairs.end(); p != pend && n < N; ++p, ++n) {
			// skip p if it is a half-pair but not the last one in the sequence
			if (!p->right && std::next(begin) != end)
				continue;
			// to lower the chance of a misread, one can require each pair to have been seen at least N times.
			// e.g: if (p.count < 2) break;
			stack.push_back(*p);
			if (FindValidSequence(all, std::next(begin), end, stack))
				return true;
			stack.pop_back();
		}
	}

	return false;
}